

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O0

ltc_store_data * __thiscall ltc::get_store_data(ltc_store_data *__return_storage_ptr__,ltc *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  col_type *pcVar6;
  float *pfVar7;
  float t4;
  float t3;
  float t2;
  float t1;
  float t0;
  float e;
  float d;
  float c;
  float b;
  float a;
  mat3 framed_mtx;
  ltc *this_local;
  
  framed_mtx.value[2].field_0._4_8_ = this;
  get_framed_ltc_matrix((mat3 *)&b,this);
  pcVar6 = glm::mat<3,_3,_float,_(glm::precision)0>::operator[]
                     ((mat<3,_3,_float,_(glm::precision)0> *)&b,0);
  pfVar7 = glm::vec<3,_float,_(glm::precision)0>::operator[](pcVar6,0);
  fVar1 = *pfVar7;
  pcVar6 = glm::mat<3,_3,_float,_(glm::precision)0>::operator[]
                     ((mat<3,_3,_float,_(glm::precision)0> *)&b,0);
  pfVar7 = glm::vec<3,_float,_(glm::precision)0>::operator[](pcVar6,2);
  fVar2 = *pfVar7;
  pcVar6 = glm::mat<3,_3,_float,_(glm::precision)0>::operator[]
                     ((mat<3,_3,_float,_(glm::precision)0> *)&b,1);
  pfVar7 = glm::vec<3,_float,_(glm::precision)0>::operator[](pcVar6,1);
  fVar3 = *pfVar7;
  pcVar6 = glm::mat<3,_3,_float,_(glm::precision)0>::operator[]
                     ((mat<3,_3,_float,_(glm::precision)0> *)&b,2);
  pfVar7 = glm::vec<3,_float,_(glm::precision)0>::operator[](pcVar6,0);
  fVar4 = *pfVar7;
  pcVar6 = glm::mat<3,_3,_float,_(glm::precision)0>::operator[]
                     ((mat<3,_3,_float,_(glm::precision)0> *)&b,2);
  pfVar7 = glm::vec<3,_float,_(glm::precision)0>::operator[](pcVar6,2);
  fVar5 = *pfVar7;
  *(ulong *)(__return_storage_ptr__->matrix_parameters)._M_elems =
       CONCAT44(-fVar2 * fVar3,fVar3 * fVar5);
  *(ulong *)((__return_storage_ptr__->matrix_parameters)._M_elems + 2) =
       CONCAT44(-fVar3 * fVar4,fVar1 * fVar5 + -(fVar2 * fVar4));
  (__return_storage_ptr__->matrix_parameters)._M_elems[4] = fVar1 * fVar3;
  __return_storage_ptr__->distribution_norm = this->_amplitude;
  __return_storage_ptr__->fresnel_term = this->_fresnel;
  return __return_storage_ptr__;
}

Assistant:

ltc_store_data ltc::get_store_data() const
{
  auto framed_mtx = get_framed_ltc_matrix();

  float a = framed_mtx[0][0];
  float b = framed_mtx[0][2];
  float c = framed_mtx[1][1];
  float d = framed_mtx[2][0];
  float e = framed_mtx[2][2];

  // Rescaled inverse of m:
  // a 0 b   inverse  c*e     0     -b*c
  // 0 c 0     ==>     0  a*e - b*d   0
  // d 0 e           -c*d     0      a*c

  float t0 = c * e;
  float t1 = -b * c;
  float t2 = a * e - b * d;
  float t3 = -c * d;
  float t4 = a * c;

  ltc_store_data store_data;
  store_data.matrix_parameters = {t0, t1, t2, t3, t4};
  store_data.distribution_norm = _amplitude;
  store_data.fresnel_term = _fresnel;

  return store_data;
}